

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TupleMake * __thiscall
wasm::Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands)

{
  TupleMake *this_00;
  TupleMake *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::TupleMake>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,operands);
  TupleMake::finalize(this_00);
  return this_00;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }